

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O0

QString * __thiscall UnixMakefileGenerator::defaultInstall(UnixMakefileGenerator *this,QString *t)

{
  bool bVar1;
  FileFixifyTypes fix;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  QMakeProject *pQVar7;
  QList<ProString> *this_00;
  qsizetype qVar8;
  MakefileGenerator *this_01;
  long lVar9;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_QString_&> QVar10;
  int i_2;
  int lslash;
  int i_1;
  ProString *src_1;
  ProStringList *__range2;
  int dstlen;
  int i;
  ProStringList *targets;
  ProStringList *uninst;
  bool isAux;
  anon_enum_32 bundle;
  QString *ret;
  QString dst_meta_dir;
  QString dst_meta;
  QString src_meta;
  QString meta;
  QString type;
  QStringList types;
  QString dst_link;
  QString link;
  QString dst_1;
  ProString file;
  iterator __end2;
  iterator __begin2;
  QString copy_cmd;
  QString suffix;
  QString dst_targ;
  QString plain_targ;
  QString src_targ;
  QString dst;
  QString src;
  QString target;
  ProStringList links;
  QString targetdir;
  QString destdir;
  QString root;
  undefined4 in_stack_ffffffffffffdfa8;
  SectionFlag in_stack_ffffffffffffdfac;
  QMakeProject *in_stack_ffffffffffffdfb0;
  QMakeProject *in_stack_ffffffffffffdfb8;
  int in_stack_ffffffffffffdfc0;
  undefined2 in_stack_ffffffffffffdfc4;
  undefined1 in_stack_ffffffffffffdfc6;
  byte in_stack_ffffffffffffdfc7;
  QMakeProject *in_stack_ffffffffffffdfc8;
  undefined6 in_stack_ffffffffffffdfd0;
  undefined1 in_stack_ffffffffffffdfd6;
  byte bVar11;
  undefined1 in_stack_ffffffffffffdfd7;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
  *in_stack_ffffffffffffdfd8;
  undefined6 in_stack_ffffffffffffdfe0;
  byte in_stack_ffffffffffffdfe6;
  byte bVar12;
  undefined1 in_stack_ffffffffffffdfe7;
  MakefileGenerator *in_stack_ffffffffffffdfe8;
  long in_stack_ffffffffffffdff8;
  undefined7 in_stack_ffffffffffffe000;
  byte bVar13;
  undefined8 in_stack_ffffffffffffe008;
  bool local_1fc9;
  QMakeProject *in_stack_ffffffffffffe050;
  undefined1 uVar14;
  QMakeProject *in_stack_ffffffffffffe058;
  MakefileGenerator *in_stack_ffffffffffffe060;
  byte local_1f09;
  bool local_1ee1;
  bool local_1e89;
  byte local_1e01;
  bool local_1d72;
  bool local_1d4e;
  int local_1d48;
  int local_1d3c;
  int local_1d18;
  int local_1cf0;
  QFileInfo local_1bf8 [8];
  undefined8 local_1bf0;
  undefined8 local_1be8;
  undefined8 local_1be0;
  undefined1 local_1bd8 [160];
  QStringBuilder<QString_&,_QString_&> local_1b38;
  undefined1 local_1af8 [4];
  FileFixifyTypes fix_00;
  QList<QString> local_1920 [5];
  QStringBuilder<const_char_(&)[14],_QString_&> local_18a8;
  QStringBuilder<const_char_(&)[25],_QString_&> local_1838;
  QStringBuilder<QString_&,_QString_&> local_1820;
  undefined1 local_17e0 [24];
  undefined8 local_17c8;
  undefined8 local_17c0;
  undefined8 local_17b8;
  QStringBuilder<QString_&,_ProString_&> local_1798;
  QString local_1770;
  QStringBuilder<const_char_(&)[14],_QString_&> local_1758;
  QStringBuilder<const_char_(&)[14],_QString_&> local_15f8;
  QStringBuilder<const_char_(&)[11],_QString_&> local_15d0;
  QStringBuilder<QString_&,_ProString_&> local_1550;
  undefined1 local_1510 [24];
  undefined8 local_14f8;
  undefined8 local_14f0;
  undefined8 local_14e8;
  undefined1 local_14e0 [48];
  ProString *local_14b0;
  iterator local_14a8;
  iterator local_14a0 [13];
  ProString local_1438;
  QStringBuilder<const_char_(&)[14],_QString_&> local_1408;
  QStringBuilder<const_char_(&)[17],_QString_&> local_13c8;
  undefined1 local_1351;
  char local_1350;
  QString *local_1348;
  undefined1 local_1340 [48];
  undefined1 local_1310 [200];
  undefined1 local_1248 [48];
  undefined1 local_1218 [520];
  undefined1 local_1010 [48];
  undefined1 local_fe0 [318];
  undefined1 local_ea2;
  undefined1 local_ea1;
  undefined1 local_ea0 [48];
  undefined1 local_e70 [104];
  QStringBuilder<const_QString_&,_const_char_(&)[8]> local_e08;
  undefined1 local_d49;
  QStringBuilder<const_char_(&)[21],_QString_&> local_d48;
  QStringBuilder<const_char_(&)[11],_QString_&> local_d38;
  undefined1 local_cd9;
  QStringBuilder<const_char_(&)[13],_QString_&> local_cd8;
  undefined1 local_c49;
  QStringBuilder<const_char_(&)[13],_QString_&> local_c48;
  undefined8 local_c38;
  undefined8 local_c30;
  undefined8 local_c28;
  undefined1 local_c20 [24];
  undefined1 local_c08 [24];
  QStringBuilder<const_char_(&)[16],_QString_&> local_bf0;
  undefined8 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined1 local_9b0 [24];
  undefined8 local_998;
  undefined8 local_990;
  undefined8 local_988;
  QStringBuilder<QString_&,_QString_&> local_978;
  undefined8 local_938;
  undefined8 local_930;
  undefined8 local_928;
  QStringBuilder<QString_&,_QString_&> local_920;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  QStringBuilder<const_char_(&)[14],_QString_&> local_8c8;
  undefined1 local_851;
  undefined1 local_850 [24];
  undefined1 local_838 [62];
  QChar local_7fa [41];
  undefined1 local_7a8 [24];
  undefined8 local_790;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_768;
  QStringBuilder<const_QString_&,_const_char_(&)[9]> local_4a8;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  QList<ProString> local_450 [7];
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  QStringBuilder<const_QString_&,_const_char_(&)[11]> local_2f8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  char *local_1e0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e0 = "target";
  bVar3 = ::operator!=((QString *)in_stack_ffffffffffffdfb0,
                       (char **)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
  local_1d4e = true;
  if (!bVar3) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
    local_1d4e = ProString::operator==
                           ((ProString *)
                            CONCAT17(in_stack_ffffffffffffdfd7,
                                     CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                            (char *)in_stack_ffffffffffffdfc8);
    ProString::~ProString((ProString *)0x1f55b5);
    ProKey::~ProKey((ProKey *)0x1f55ce);
  }
  if (local_1d4e == false) {
    local_1cf0 = 0;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
    bVar3 = ProString::operator==
                      ((ProString *)
                       CONCAT17(in_stack_ffffffffffffdfd7,
                                CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                       (char *)in_stack_ffffffffffffdfc8);
    ProString::~ProString((ProString *)0x1f5668);
    ProKey::~ProKey((ProKey *)0x1f5675);
    local_2b8 = 0xaaaaaaaaaaaaaaaa;
    local_2b0 = 0xaaaaaaaaaaaaaaaa;
    local_2a8 = 0xaaaaaaaaaaaaaaaa;
    (**(code **)(*in_RSI + 0x98))(&local_2b8);
    local_2f8 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                            (char (*) [11])
                            CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    ProKey::ProKey<QString_const&,char_const(&)[11]>
              ((ProKey *)in_stack_ffffffffffffdfb0,
               (QStringBuilder<const_QString_&,_const_char_(&)[11]> *)
               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    pQVar7 = (QMakeProject *)
             QMakeProject::values
                       (in_stack_ffffffffffffdfb0,
                        (ProKey *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    ProKey::~ProKey((ProKey *)0x1f5757);
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QString::QString((QString *)0x1f579c);
    local_310 = 0xaaaaaaaaaaaaaaaa;
    local_308 = 0xaaaaaaaaaaaaaaaa;
    local_300 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
    ProString::toQString((ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
    ;
    ProString::~ProString((ProString *)0x1f5833);
    ProKey::~ProKey((ProKey *)0x1f5840);
    bVar4 = QString::isEmpty((QString *)0x1f584d);
    local_1d72 = false;
    if (!bVar4) {
      QString::right((QString *)in_stack_ffffffffffffdfc8,
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )));
      local_1d72 = ::operator!=((QString *)in_stack_ffffffffffffdfb0,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::~QString((QString *)0x1f58c9);
    }
    if (local_1d72 != false) {
      QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                          (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    }
    local_3a0 = 0xaaaaaaaaaaaaaaaa;
    local_398 = 0xaaaaaaaaaaaaaaaa;
    local_390 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
    ProString::toQString((ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
    ;
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffdfb0,
               in_stack_ffffffffffffdfac);
    uVar2 = _local_1af8;
    fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
    super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i = SUB84((ulong)_local_1af8 >> 0x20,0);
    MakefileGenerator::fileFixify
              (in_stack_ffffffffffffe060,(QString *)in_stack_ffffffffffffe058,fix_00,
               SUB81((ulong)in_stack_ffffffffffffe050 >> 0x38,0));
    _local_1af8 = uVar2;
    QString::~QString((QString *)0x1f59bd);
    ProString::~ProString((ProString *)0x1f59ca);
    ProKey::~ProKey((ProKey *)0x1f59d7);
    QString::right((QString *)in_stack_ffffffffffffdfc8,
                   CONCAT17(in_stack_ffffffffffffdfc7,
                            CONCAT16(in_stack_ffffffffffffdfc6,
                                     CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)))
                  );
    bVar4 = ::operator!=((QString *)in_stack_ffffffffffffdfb0,
                         (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QString::~QString((QString *)0x1f5a19);
    if (bVar4) {
      QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                          (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    }
    local_450[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_450[0].d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_450[0].d.size = -0x5555555555555556;
    ProStringList::ProStringList((ProStringList *)0x1f5a74);
    local_468 = 0xaaaaaaaaaaaaaaaa;
    local_460 = 0xaaaaaaaaaaaaaaaa;
    local_458 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
    local_4a8 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                            (char (*) [9])
                            CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    ProKey::ProKey<QString_const&,char_const(&)[9]>
              ((ProKey *)in_stack_ffffffffffffdfb0,
               (QStringBuilder<const_QString_&,_const_char_(&)[9]> *)
               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    this_00 = &QMakeProject::values
                         (in_stack_ffffffffffffdfb0,
                          (ProKey *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))->
               super_QList<ProString>;
    ProKey::~ProKey((ProKey *)0x1f5b41);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    bVar4 = QMakeProject::isEmpty
                      (in_stack_ffffffffffffdfc8,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffffdfc7,
                                CONCAT16(in_stack_ffffffffffffdfc6,
                                         CONCAT24(in_stack_ffffffffffffdfc4,
                                                  in_stack_ffffffffffffdfc0))));
    ProKey::~ProKey((ProKey *)0x1f5ba7);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      bVar4 = ProString::operator==
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffffdfd7,
                                  CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                         (char *)in_stack_ffffffffffffdfc8);
      ProString::~ProString((ProString *)0x1f5d2d);
      ProKey::~ProKey((ProKey *)0x1f5d3a);
      if (bVar4) {
        QString::operator=((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfd8);
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                       (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffffdfc7,
                            CONCAT16(in_stack_ffffffffffffdfc6,
                                     CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)))
                  );
        bVar4 = ProString::operator==
                          ((ProString *)
                           CONCAT17(in_stack_ffffffffffffdfd7,
                                    CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                           (char *)in_stack_ffffffffffffdfc8);
        ProString::~ProString((ProString *)0x1f5dd0);
        ProKey::~ProKey((ProKey *)0x1f5ddd);
        if (bVar4) {
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          bVar6 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                             SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
          bVar1 = false;
          bVar4 = false;
          local_1e01 = 0;
          if (!bVar6) {
            QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8)
            ;
            bVar1 = true;
            bVar6 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                               SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
            local_1e01 = 0;
            if (!bVar6) {
              QString::QString((QString *)in_stack_ffffffffffffdfb8,
                               (char *)in_stack_ffffffffffffdfe8);
              bVar4 = true;
              bVar6 = QMakeProject::isActiveConfig
                                (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                                 SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
              local_1e01 = bVar6 ^ 0xff;
            }
          }
          if (bVar4) {
            QString::~QString((QString *)0x1f5f27);
          }
          if (bVar1) {
            QString::~QString((QString *)0x1f5f40);
          }
          QString::~QString((QString *)0x1f5f4d);
          if ((local_1e01 & 1) != 0) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                           (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            bVar4 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffdfc8,
                               (ProKey *)
                               CONCAT17(in_stack_ffffffffffffdfc7,
                                        CONCAT16(in_stack_ffffffffffffdfc6,
                                                 CONCAT24(in_stack_ffffffffffffdfc4,
                                                          in_stack_ffffffffffffdfc0))));
            ProKey::~ProKey((ProKey *)0x1f5fb1);
            if (bVar4) {
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
              ProStringList::operator<<
                        ((ProStringList *)in_stack_ffffffffffffdfb0,
                         (ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
              ;
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
              ProStringList::operator<<
                        ((ProStringList *)in_stack_ffffffffffffdfb0,
                         (ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
              ;
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
              ProStringList::operator<<
                        ((ProStringList *)in_stack_ffffffffffffdfb0,
                         (ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
              ;
              ProString::~ProString((ProString *)0x1f6059);
              ProString::~ProString((ProString *)0x1f6066);
              ProString::~ProString((ProString *)0x1f6073);
            }
            else {
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
              ProStringList::operator<<
                        ((ProStringList *)in_stack_ffffffffffffdfb0,
                         (ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
              ;
              ProString::~ProString((ProString *)0x1f60ab);
            }
          }
        }
      }
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                         (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::~QString((QString *)0x1f5c36);
      ProString::~ProString((ProString *)0x1f5c43);
      ProKey::~ProKey((ProKey *)0x1f5c50);
      QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
      bVar4 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                         SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
      local_1cf0 = 1;
      if (bVar4) {
        local_1cf0 = 2;
      }
      QString::~QString((QString *)0x1f5cb8);
    }
    for (local_1d18 = 0; qVar8 = QList<ProString>::size(this_00), local_1d18 < qVar8;
        local_1d18 = local_1d18 + 1) {
      local_778 = 0xaaaaaaaaaaaaaaaa;
      local_770 = 0xaaaaaaaaaaaaaaaa;
      local_768 = 0xaaaaaaaaaaaaaaaa;
      QList<ProString>::at
                ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      local_790 = 0xaaaaaaaaaaaaaaaa;
      local_788 = 0xaaaaaaaaaaaaaaaa;
      local_780 = 0xaaaaaaaaaaaaaaaa;
      QChar::QChar<char,_true>(local_7fa,'/');
      QFlags<QString::SectionFlag>::QFlags
                ((QFlags<QString::SectionFlag> *)in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfac
                );
      QString::section((QString *)in_stack_ffffffffffffdfd8,
                       (QChar)(char16_t)((ulong)in_stack_ffffffffffffe008 >> 0x30),
                       CONCAT17(in_stack_ffffffffffffdfd7,
                                CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                       (qsizetype)in_stack_ffffffffffffdfc8,
                       (QFlagsStorageHelper<QString::SectionFlag,_4>)
                       SUB84(in_stack_ffffffffffffe008,0));
      ::operator+((QString *)in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QString> *)
                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      MakefileGenerator::filePrefixRoot
                ((MakefileGenerator *)in_stack_ffffffffffffdfc8,
                 (QString *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))),
                 (QString *)in_stack_ffffffffffffdfb8);
      (**(code **)(*in_RSI + 0x60))(&local_790,in_RSI,local_7a8);
      QString::~QString((QString *)0x1f6243);
      QString::~QString((QString *)0x1f6250);
      QStringBuilder<QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<QString_&,_QString> *)0x1f625d);
      QString::~QString((QString *)0x1f626a);
      bVar4 = QString::isEmpty((QString *)0x1f6277);
      if (!bVar4) {
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
      }
      Option::fixPathToTargetOS
                ((QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7,
                 (bool)in_stack_ffffffffffffdfc6);
      (**(code **)(*in_RSI + 0x60))(local_838,in_RSI,local_850);
      ::operator+((char (*) [13])in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
      local_851 = 0x20;
      ::operator+((QStringBuilder<const_char_(&)[13],_QString> *)in_stack_ffffffffffffdfb8,
                  (char *)in_stack_ffffffffffffdfb0);
      ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char> *)
                  in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
      ::operator+=((QString *)
                   CONCAT17(in_stack_ffffffffffffdfe7,
                            CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>
                    *)in_stack_ffffffffffffdfd8);
      QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>::
      ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>
                       *)0x1f6349);
      QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char> *)0x1f6356);
      QStringBuilder<const_char_(&)[13],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[13],_QString> *)0x1f6363);
      QString::~QString((QString *)0x1f6370);
      QString::~QString((QString *)0x1f637d);
      bVar4 = QList<ProString>::isEmpty((QList<ProString> *)0x1f638a);
      if (!bVar4) {
        ProString::ProString
                  ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                   (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ProString::~ProString((ProString *)0x1f63d4);
      }
      local_8c8 = ::operator+((char (*) [14])in_stack_ffffffffffffdfb0,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::ProString<char_const(&)[14],QString&>
                ((ProString *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))),
                 (QStringBuilder<const_char_(&)[14],_QString_&> *)in_stack_ffffffffffffdfb8);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::~ProString((ProString *)0x1f643f);
      QString::~QString((QString *)0x1f644c);
      QString::~QString((QString *)0x1f6459);
    }
    local_8e0 = 0xaaaaaaaaaaaaaaaa;
    local_8d8 = 0xaaaaaaaaaaaaaaaa;
    local_8d0 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_ffffffffffffdfb0,
                     (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    bVar4 = QString::isEmpty((QString *)0x1f64be);
    if (!bVar4) {
      local_920 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QString_&> *)
                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      Option::fixPathToTargetOS
                ((QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7,
                 (bool)in_stack_ffffffffffffdfc6);
      QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                         (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::~QString((QString *)0x1f653e);
      QString::~QString((QString *)0x1f654b);
    }
    local_938 = 0xaaaaaaaaaaaaaaaa;
    local_930 = 0xaaaaaaaaaaaaaaaa;
    local_928 = 0xaaaaaaaaaaaaaaaa;
    local_978 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                            (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                           );
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)
               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffdfb0,
               in_stack_ffffffffffffdfac);
    uVar2 = _local_1af8;
    fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
    super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i = SUB84((ulong)_local_1af8 >> 0x20,0);
    MakefileGenerator::fileFixify
              (in_stack_ffffffffffffe060,(QString *)in_stack_ffffffffffffe058,fix_00,
               SUB81((ulong)in_stack_ffffffffffffe050 >> 0x38,0));
    _local_1af8 = uVar2;
    MakefileGenerator::filePrefixRoot
              ((MakefileGenerator *)in_stack_ffffffffffffdfc8,
               (QString *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))),
               (QString *)in_stack_ffffffffffffdfb8);
    QString::~QString((QString *)0x1f6620);
    QString::~QString((QString *)0x1f662d);
    local_998 = 0xaaaaaaaaaaaaaaaa;
    local_990 = 0xaaaaaaaaaaaaaaaa;
    local_988 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_ffffffffffffdfb0,
                     (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    (**(code **)(*in_RSI + 0x60))(local_9b0,in_RSI,&local_938);
    QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                       (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QString::~QString((QString *)0x1f66af);
    if (local_1cf0 != 0) {
      local_9c8 = 0xaaaaaaaaaaaaaaaa;
      local_9c0 = 0xaaaaaaaaaaaaaaaa;
      local_9b8 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x1f66f7);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      bVar4 = ProString::operator==
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffffdfd7,
                                  CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                         (char *)in_stack_ffffffffffffdfc8);
      ProString::~ProString((ProString *)0x1f6767);
      ProKey::~ProKey((ProKey *)0x1f6774);
      if (bVar4) {
        QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
        bVar4 = QMakeProject::isActiveConfig
                          (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                           SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
        QString::~QString((QString *)0x1f67dc);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                         (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )));
          ::operator+((char (*) [11])in_stack_ffffffffffffdfb8,
                      (ProString *)in_stack_ffffffffffffdfb0);
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<const_char_(&)[11],_ProString> *)in_stack_ffffffffffffdfd8);
          QStringBuilder<const_char_(&)[11],_ProString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[11],_ProString> *)0x1f6872);
          ProString::~ProString((ProString *)0x1f687f);
          ProKey::~ProKey((ProKey *)0x1f688c);
        }
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                       (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                   (ProKey *)
                   CONCAT17(in_stack_ffffffffffffdfc7,
                            CONCAT16(in_stack_ffffffffffffdfc6,
                                     CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)))
                  );
        ::operator+((char (*) [2])in_stack_ffffffffffffdfb8,(ProString *)in_stack_ffffffffffffdfb0);
        ::operator+((QStringBuilder<const_char_(&)[2],_ProString> *)in_stack_ffffffffffffdfb8,
                    (char (*) [17])in_stack_ffffffffffffdfb0);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>
                    *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                           (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
        ;
        QString::~QString((QString *)0x1f695c);
        QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>::
        ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>
                         *)0x1f6969);
        QStringBuilder<const_char_(&)[2],_ProString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[2],_ProString> *)0x1f6976);
        ProString::~ProString((ProString *)0x1f6983);
        ProKey::~ProKey((ProKey *)0x1f6990);
      }
      QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                          (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      if (local_1cf0 == 1) {
        bVar4 = QString::isEmpty((QString *)0x1f69bc);
        if (!bVar4) {
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8
                             );
        }
        local_bf0 = ::operator+((char (*) [16])in_stack_ffffffffffffdfb0,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+((QStringBuilder<const_char_(&)[16],_QString_&> *)in_stack_ffffffffffffdfb0,
                    (char (*) [3])CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QStringBuilder<QStringBuilder<const_char_(&)[16],_QString_&>,_const_char_(&)[3]>
                      *)in_stack_ffffffffffffdfd8);
      }
      else {
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                            (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                           );
      }
      QString::~QString((QString *)0x1f6a4d);
    }
    (**(code **)(*in_RSI + 0x60))(local_c08,in_RSI,&local_8e0);
    QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                       (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QString::~QString((QString *)0x1f6a8d);
    (**(code **)(*in_RSI + 0x60))(local_c20,in_RSI,&local_998);
    QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                       (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QString::~QString((QString *)0x1f6acd);
    local_c38 = 0xaaaaaaaaaaaaaaaa;
    local_c30 = 0xaaaaaaaaaaaaaaaa;
    local_c28 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x1f6b07);
    if (local_1cf0 == 1) {
      local_c48 = ::operator+((char (*) [13])in_stack_ffffffffffffdfb0,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      local_c49 = 0x20;
      ::operator+((QStringBuilder<const_char_(&)[13],_QString_&> *)in_stack_ffffffffffffdfb0,
                  (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char> *)
                  in_stack_ffffffffffffdfb0,
                  (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ::operator+=((QString *)
                   CONCAT17(in_stack_ffffffffffffdfe7,
                            CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                    *)in_stack_ffffffffffffdfd8);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      bVar4 = ProString::operator==
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffffdfd7,
                                  CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                         (char *)in_stack_ffffffffffffdfc8);
      local_1e89 = false;
      if (bVar4) {
        QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
        local_1e89 = QMakeProject::isActiveConfig
                               (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                                SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
        QString::~QString((QString *)0x1f6c83);
      }
      ProString::~ProString((ProString *)0x1f6c90);
      ProKey::~ProKey((ProKey *)0x1f6c9d);
      if (local_1e89 == false) {
        if (!bVar3) {
          if (local_1cf0 == 2) {
            bVar4 = QString::isEmpty((QString *)0x1f6d56);
            if (!bVar4) {
              QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                                  (char *)in_stack_ffffffffffffdfc8);
            }
            local_d38 = ::operator+((char (*) [11])in_stack_ffffffffffffdfb0,
                                    (QString *)
                                    CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            ::operator+((QStringBuilder<const_char_(&)[11],_QString_&> *)in_stack_ffffffffffffdfb0,
                        (char (*) [3])CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
            ;
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                        *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            MakefileGenerator::mkdir_p_asstring
                      ((MakefileGenerator *)
                       CONCAT17(in_stack_ffffffffffffdfd7,
                                CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                       (QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7);
            QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            QString::~QString((QString *)0x1f6e04);
            QString::~QString((QString *)0x1f6e11);
          }
          local_d48 = ::operator+((char (*) [21])in_stack_ffffffffffffdfb0,
                                  (QString *)
                                  CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          local_d49 = 0x20;
          ::operator+((QStringBuilder<const_char_(&)[21],_QString_&> *)in_stack_ffffffffffffdfb0,
                      (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[21],_QString_&>,_char> *)
                      in_stack_ffffffffffffdfb0,
                      (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[21],_QString_&>,_char>,_QString_&>
                        *)in_stack_ffffffffffffdfd8);
        }
      }
      else {
        local_cd8 = ::operator+((char (*) [13])in_stack_ffffffffffffdfb0,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        local_cd9 = 0x20;
        ::operator+((QStringBuilder<const_char_(&)[13],_QString_&> *)in_stack_ffffffffffffdfb0,
                    (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char> *)
                    in_stack_ffffffffffffdfb0,
                    (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                      *)in_stack_ffffffffffffdfd8);
      }
    }
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
    QMakeEvaluator::first
              (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
               (ProKey *)
               CONCAT17(in_stack_ffffffffffffdfc7,
                        CONCAT16(in_stack_ffffffffffffdfc6,
                                 CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
    bVar5 = ProString::operator==
                      ((ProString *)
                       CONCAT17(in_stack_ffffffffffffdfd7,
                                CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                       (char *)in_stack_ffffffffffffdfc8);
    bVar6 = false;
    bVar1 = false;
    bVar4 = false;
    if (bVar5) {
      QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
      bVar6 = true;
      bVar5 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                         SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
      bVar4 = false;
      if (!bVar5) {
        local_e08 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                                (char (*) [8])
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ProKey::ProKey<QString_const&,char_const(&)[8]>
                  ((ProKey *)in_stack_ffffffffffffdfb0,
                   (QStringBuilder<const_QString_&,_const_char_(&)[8]> *)
                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        bVar1 = true;
        QMakeProject::values
                  (in_stack_ffffffffffffdfb0,
                   (ProKey *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        qVar8 = QListSpecialMethodsBase<ProString>::indexOf<char[10]>
                          ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffdfb0,
                           (char (*) [10])
                           CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8),0x1f6fef);
        bVar4 = qVar8 != -1;
      }
    }
    if (bVar1) {
      ProKey::~ProKey((ProKey *)0x1f7024);
    }
    if (bVar6) {
      QString::~QString((QString *)0x1f703d);
    }
    ProString::~ProString((ProString *)0x1f704a);
    ProKey::~ProKey((ProKey *)0x1f7057);
    if (bVar4) {
      bVar4 = QString::isEmpty((QString *)0x1f7074);
      if (!bVar4) {
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
      }
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      bVar4 = QMakeProject::isEmpty
                        (in_stack_ffffffffffffdfc8,
                         (ProKey *)
                         CONCAT17(in_stack_ffffffffffffdfc7,
                                  CONCAT16(in_stack_ffffffffffffdfc6,
                                           CONCAT24(in_stack_ffffffffffffdfc4,
                                                    in_stack_ffffffffffffdfc0))));
      ProKey::~ProKey((ProKey *)0x1f70e2);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                       (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        bVar4 = QMakeProject::isEmpty
                          (in_stack_ffffffffffffdfc8,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffffdfc7,
                                    CONCAT16(in_stack_ffffffffffffdfc6,
                                             CONCAT24(in_stack_ffffffffffffdfc4,
                                                      in_stack_ffffffffffffdfc0))));
        ProKey::~ProKey((ProKey *)0x1f72a7);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        }
        else {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                         (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          (**(code **)(*in_RSI + 0xb0))(local_fe0,in_RSI,local_1010);
          ::operator+((char (*) [20])in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0)
          ;
          ::operator+((QStringBuilder<const_char_(&)[20],_QString> *)in_stack_ffffffffffffdfb8,
                      (QString *)in_stack_ffffffffffffdfb0);
          ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&> *)
                      in_stack_ffffffffffffdfb8,(char (*) [5])in_stack_ffffffffffffdfb0);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
                       *)in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
                       *)in_stack_ffffffffffffdfb8,(char (*) [31])in_stack_ffffffffffffdfb0);
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                        *)in_stack_ffffffffffffdfd8);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                             *)0x1f739c);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
                             *)0x1f73a9);
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
                             *)0x1f73b6);
          QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&> *)
                     0x1f73c3);
          QStringBuilder<const_char_(&)[20],_QString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[20],_QString> *)0x1f73d0);
          QString::~QString((QString *)0x1f73dd);
          ProKey::~ProKey((ProKey *)0x1f73ea);
        }
      }
      else {
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                            (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                           );
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                       (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        (**(code **)(*in_RSI + 0xb0))(local_e70,in_RSI,local_ea0);
        ::operator+((char (*) [4])in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
        local_ea1 = 0x20;
        ::operator+((QStringBuilder<const_char_(&)[4],_QString> *)in_stack_ffffffffffffdfb8,
                    (char *)in_stack_ffffffffffffdfb0);
        ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char> *)
                    in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
        local_ea2 = 0x20;
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
                     *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfb0);
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
                     *)in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
                      *)in_stack_ffffffffffffdfd8);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
                           *)0x1f71fe);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
                           *)0x1f720b);
        QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
                           *)0x1f7218);
        QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char> *)0x1f7225);
        QStringBuilder<const_char_(&)[4],_QString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[4],_QString> *)0x1f7232);
        QString::~QString((QString *)0x1f723f);
        ProKey::~ProKey((ProKey *)0x1f724c);
      }
    }
    else {
      bVar4 = QString::isEmpty((QString *)0x1f7412);
      if (!bVar4) {
        bVar4 = QString::isEmpty((QString *)0x1f7423);
        if (!bVar4) {
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8
                             );
        }
        QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                            (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                           );
      }
    }
    if (!bVar3) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      bVar4 = ProString::operator==
                        ((ProString *)
                         CONCAT17(in_stack_ffffffffffffdfd7,
                                  CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                         (char *)in_stack_ffffffffffffdfc8);
      local_1ee1 = false;
      if (bVar4) {
        QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
        local_1ee1 = QMakeProject::isActiveConfig
                               (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                                SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
        QString::~QString((QString *)0x1f754f);
      }
      ProString::~ProString((ProString *)0x1f755c);
      ProKey::~ProKey((ProKey *)0x1f7569);
      if (local_1ee1 == false) {
        QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
        bVar6 = QMakeProject::isActiveConfig
                          (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                           SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
        bVar1 = false;
        bVar4 = false;
        local_1f09 = 0;
        if (!bVar6) {
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          bVar1 = true;
          bVar6 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                             SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
          local_1f09 = 0;
          if (!bVar6) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                           (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            bVar4 = true;
            bVar6 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffdfc8,
                               (ProKey *)
                               CONCAT17(in_stack_ffffffffffffdfc7,
                                        CONCAT16(in_stack_ffffffffffffdfc6,
                                                 CONCAT24(in_stack_ffffffffffffdfc4,
                                                          in_stack_ffffffffffffdfc0))));
            local_1f09 = bVar6 ^ 0xff;
          }
        }
        if (bVar4) {
          ProKey::~ProKey((ProKey *)0x1f7779);
        }
        if (bVar1) {
          QString::~QString((QString *)0x1f7792);
        }
        QString::~QString((QString *)0x1f779f);
        if ((local_1f09 & 1) != 0) {
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8
                             );
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                         (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                     (ProKey *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )));
          bVar4 = ProString::operator==
                            ((ProString *)
                             CONCAT17(in_stack_ffffffffffffdfd7,
                                      CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0))
                             ,(char *)in_stack_ffffffffffffdfc8);
          ProString::~ProString((ProString *)0x1f7833);
          ProKey::~ProKey((ProKey *)0x1f7840);
          if (bVar4) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                           (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            bVar4 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffdfc8,
                               (ProKey *)
                               CONCAT17(in_stack_ffffffffffffdfc7,
                                        CONCAT16(in_stack_ffffffffffffdfc6,
                                                 CONCAT24(in_stack_ffffffffffffdfc4,
                                                          in_stack_ffffffffffffdfc0))));
            ProKey::~ProKey((ProKey *)0x1f78a6);
            if (((bVar4 ^ 0xffU) & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                             (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
              (**(code **)(*in_RSI + 0xb0))(local_1218,in_RSI,local_1248);
              ::operator+((char (*) [2])in_stack_ffffffffffffdfb8,
                          (QString *)in_stack_ffffffffffffdfb0);
              ::operator+=((QString *)
                           CONCAT17(in_stack_ffffffffffffdfe7,
                                    CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                           (QStringBuilder<const_char_(&)[2],_QString> *)in_stack_ffffffffffffdfd8);
              QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                        ((QStringBuilder<const_char_(&)[2],_QString> *)0x1f7929);
              QString::~QString((QString *)0x1f7936);
              ProKey::~ProKey((ProKey *)0x1f7943);
            }
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                           (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            QMakeEvaluator::first
                      (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                       (ProKey *)
                       CONCAT17(in_stack_ffffffffffffdfc7,
                                CONCAT16(in_stack_ffffffffffffdfc6,
                                         CONCAT24(in_stack_ffffffffffffdfc4,
                                                  in_stack_ffffffffffffdfc0))));
            bVar4 = ProString::operator==
                              ((ProString *)
                               CONCAT17(in_stack_ffffffffffffdfd7,
                                        CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0
                                                )),(char *)in_stack_ffffffffffffdfc8);
            ProString::~ProString((ProString *)0x1f79b8);
            ProKey::~ProKey((ProKey *)0x1f79c5);
            if (bVar4) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                             (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
              bVar4 = QMakeProject::isEmpty
                                (in_stack_ffffffffffffdfc8,
                                 (ProKey *)
                                 CONCAT17(in_stack_ffffffffffffdfc7,
                                          CONCAT16(in_stack_ffffffffffffdfc6,
                                                   CONCAT24(in_stack_ffffffffffffdfc4,
                                                            in_stack_ffffffffffffdfc0))));
              ProKey::~ProKey((ProKey *)0x1f7a2b);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                               (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                              );
                (**(code **)(*in_RSI + 0xb0))(local_1310,in_RSI,local_1340);
                ::operator+((char (*) [2])in_stack_ffffffffffffdfb8,
                            (QString *)in_stack_ffffffffffffdfb0);
                ::operator+=((QString *)
                             CONCAT17(in_stack_ffffffffffffdfe7,
                                      CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0))
                             ,(QStringBuilder<const_char_(&)[2],_QString> *)
                              in_stack_ffffffffffffdfd8);
                QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[2],_QString> *)0x1f7aae);
                QString::~QString((QString *)0x1f7abb);
                ProKey::~ProKey((ProKey *)0x1f7ac8);
              }
            }
          }
          local_1351 = 0x20;
          QVar10 = ::operator+((char *)in_stack_ffffffffffffdfb0,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          local_1348 = QVar10.b;
          local_1350 = QVar10.a;
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<char,_QString_&> *)in_stack_ffffffffffffdfd8);
        }
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                       (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        bVar4 = QMakeProject::isEmpty
                          (in_stack_ffffffffffffdfc8,
                           (ProKey *)
                           CONCAT17(in_stack_ffffffffffffdfc7,
                                    CONCAT16(in_stack_ffffffffffffdfc6,
                                             CONCAT24(in_stack_ffffffffffffdfc4,
                                                      in_stack_ffffffffffffdfc0))));
        ProKey::~ProKey((ProKey *)0x1f75cf);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          ::operator+((QString *)in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<QString,_QString_&> *)in_stack_ffffffffffffdfd8);
          QStringBuilder<QString,_QString_&>::~QStringBuilder
                    ((QStringBuilder<QString,_QString_&> *)0x1f762f);
          QString::~QString((QString *)0x1f763c);
        }
      }
    }
    bVar4 = QList<ProString>::isEmpty((QList<ProString> *)0x1f7b1e);
    if (!bVar4) {
      ProString::ProString((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8)
      ;
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::~ProString((ProString *)0x1f7b68);
    }
    if (local_1cf0 == 1) {
      local_13c8 = ::operator+((char (*) [17])in_stack_ffffffffffffdfb0,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::ProString<char_const(&)[17],QString&>
                ((ProString *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))),
                 (QStringBuilder<const_char_(&)[17],_QString_&> *)in_stack_ffffffffffffdfb8);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::~ProString((ProString *)0x1f7bdd);
    }
    else if (!bVar3) {
      local_1408 = ::operator+((char (*) [14])in_stack_ffffffffffffdfb0,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::ProString<char_const(&)[14],QString&>
                ((ProString *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))),
                 (QStringBuilder<const_char_(&)[14],_QString_&> *)in_stack_ffffffffffffdfb8);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProString::~ProString((ProString *)0x1f7c54);
    }
    if (local_1cf0 == 2) {
      in_stack_ffffffffffffe060 = (MakefileGenerator *)in_RSI[0x1b];
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      ProString::length(&local_1438);
      ProString::~ProString((ProString *)0x1f7ccd);
      ProKey::~ProKey((ProKey *)0x1f7cda);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeProject::values
                (in_stack_ffffffffffffdfb0,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      ProKey::~ProKey((ProKey *)0x1f7d4f);
      local_14a0[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_14a0[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffdfb0);
      local_14a8.i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_14a8 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffdfb0);
      while( true ) {
        local_14b0 = local_14a8.i;
        bVar4 = QList<ProString>::iterator::operator!=(local_14a0,local_14a8);
        uVar14 = (undefined1)((ulong)in_stack_ffffffffffffe050 >> 0x38);
        if (!bVar4) break;
        QList<ProString>::iterator::operator*(local_14a0);
        memset(local_14e0,0xaa,0x30);
        ProString::mid((ProString *)in_stack_ffffffffffffdfc8,
                       CONCAT13(in_stack_ffffffffffffdfc7,
                                CONCAT12(in_stack_ffffffffffffdfc6,in_stack_ffffffffffffdfc4)),
                       in_stack_ffffffffffffdfc0);
        local_14f8 = 0xaaaaaaaaaaaaaaaa;
        local_14f0 = 0xaaaaaaaaaaaaaaaa;
        local_14e8 = 0xaaaaaaaaaaaaaaaa;
        local_1550 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                                 (ProString *)
                                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_ProString_&> *)
                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffdfb0,
                   in_stack_ffffffffffffdfac);
        uVar2 = _local_1af8;
        fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
        super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
             SUB84((ulong)_local_1af8 >> 0x20,0);
        MakefileGenerator::fileFixify
                  (in_stack_ffffffffffffe060,(QString *)in_stack_ffffffffffffe058,fix_00,
                   (bool)uVar14);
        _local_1af8 = uVar2;
        MakefileGenerator::filePrefixRoot
                  ((MakefileGenerator *)in_stack_ffffffffffffdfc8,
                   (QString *)
                   CONCAT17(in_stack_ffffffffffffdfc7,
                            CONCAT16(in_stack_ffffffffffffdfc6,
                                     CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)))
                   ,(QString *)in_stack_ffffffffffffdfb8);
        (**(code **)(*in_RSI + 0x60))(&local_14f8,in_RSI,local_1510);
        QString::~QString((QString *)0x1f7f27);
        QString::~QString((QString *)0x1f7f34);
        QString::~QString((QString *)0x1f7f41);
        bVar4 = QString::isEmpty((QString *)0x1f7f4e);
        if (!bVar4) {
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8
                             );
        }
        local_15d0 = ::operator+((char (*) [11])in_stack_ffffffffffffdfb0,
                                 (QString *)
                                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+((QStringBuilder<const_char_(&)[11],_QString_&> *)in_stack_ffffffffffffdfb0,
                    (char (*) [3])CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                    *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        MakefileGenerator::mkdir_p_asstring
                  ((MakefileGenerator *)
                   CONCAT17(in_stack_ffffffffffffdfd7,
                            CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                   (QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7);
        ::operator+((QString *)in_stack_ffffffffffffdfb8,(char (*) [3])in_stack_ffffffffffffdfb0);
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QStringBuilder<QString,_const_char_(&)[3]> *)in_stack_ffffffffffffdfd8);
        QStringBuilder<QString,_const_char_(&)[3]>::~QStringBuilder
                  ((QStringBuilder<QString,_const_char_(&)[3]> *)0x1f8018);
        QString::~QString((QString *)0x1f8025);
        QString::~QString((QString *)0x1f8032);
        local_15f8 = ::operator+((char (*) [14])in_stack_ffffffffffffdfb0,
                                 (QString *)
                                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+((QStringBuilder<const_char_(&)[14],_QString_&> *)in_stack_ffffffffffffdfb0,
                    (char (*) [3])CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QStringBuilder<QStringBuilder<const_char_(&)[14],_QString_&>,_const_char_(&)[3]>
                      *)in_stack_ffffffffffffdfd8);
        MakefileGenerator::escapeFilePath
                  ((MakefileGenerator *)
                   CONCAT17(in_stack_ffffffffffffdfd7,
                            CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)),
                   (ProString *)in_stack_ffffffffffffdfc8);
        ::operator+((char (*) [13])in_stack_ffffffffffffdfb8,(ProString *)in_stack_ffffffffffffdfb0)
        ;
        ::operator+((QStringBuilder<const_char_(&)[13],_ProString> *)in_stack_ffffffffffffdfb8,
                    (char (*) [2])in_stack_ffffffffffffdfb0);
        ::operator+((QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>
                     *)in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
        ::operator+=((QString *)
                     CONCAT17(in_stack_ffffffffffffdfe7,
                              CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     in_stack_ffffffffffffdfd8);
        QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
                           *)0x1f811b);
        QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>::
        ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>
                         *)0x1f8128);
        QStringBuilder<const_char_(&)[13],_ProString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[13],_ProString> *)0x1f8135);
        ProString::~ProString((ProString *)0x1f8142);
        bVar4 = QList<ProString>::isEmpty((QList<ProString> *)0x1f814f);
        if (!bVar4) {
          in_stack_ffffffffffffe058 = pQVar7;
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                     (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ProString::~ProString((ProString *)0x1f8199);
        }
        in_stack_ffffffffffffe050 = pQVar7;
        local_1758 = ::operator+((char (*) [14])in_stack_ffffffffffffdfb0,
                                 (QString *)
                                 CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ProString::ProString<char_const(&)[14],QString&>
                  ((ProString *)
                   CONCAT17(in_stack_ffffffffffffdfc7,
                            CONCAT16(in_stack_ffffffffffffdfc6,
                                     CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)))
                   ,(QStringBuilder<const_char_(&)[14],_QString_&> *)in_stack_ffffffffffffdfb8);
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                   (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        ProString::~ProString((ProString *)0x1f8204);
        QString::~QString((QString *)0x1f8211);
        ProString::~ProString((ProString *)0x1f821e);
        QList<ProString>::iterator::operator++(local_14a0);
      }
    }
    bVar4 = QList<ProString>::isEmpty((QList<ProString> *)0x1f823f);
    if (!bVar4) {
      for (local_1d3c = 0; qVar8 = QList<ProString>::size(local_450), local_1d3c < qVar8;
          local_1d3c = local_1d3c + 1) {
        if (((int)in_RSI[0x1a] == 0) || ((int)in_RSI[0x1a] == 1)) {
          local_1770.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_1770.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_1770.d.size = -0x5555555555555556;
          QList<ProString>::operator[]
                    ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                     CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          local_1798 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                                   (ProString *)
                                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_ProString_&> *)
                     CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          Option::fixPathToTargetOS
                    ((QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7,
                     (bool)in_stack_ffffffffffffdfc6);
          QString::~QString((QString *)0x1f8349);
          qVar8 = QString::lastIndexOf
                            ((QString *)
                             CONCAT17(in_stack_ffffffffffffdfc7,
                                      CONCAT16(in_stack_ffffffffffffdfc6,
                                               CONCAT24(in_stack_ffffffffffffdfc4,
                                                        in_stack_ffffffffffffdfc0))),
                             (QString *)in_stack_ffffffffffffdfb8,
                             (CaseSensitivity)((ulong)in_stack_ffffffffffffdfb0 >> 0x20));
          if ((int)qVar8 != -1) {
            QString::size(&local_1770);
            QString::right((QString *)in_stack_ffffffffffffdfc8,
                           CONCAT17(in_stack_ffffffffffffdfc7,
                                    CONCAT16(in_stack_ffffffffffffdfc6,
                                             CONCAT24(in_stack_ffffffffffffdfc4,
                                                      in_stack_ffffffffffffdfc0))));
            QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            QString::~QString((QString *)0x1f83c9);
          }
          local_17c8 = 0xaaaaaaaaaaaaaaaa;
          local_17c0 = 0xaaaaaaaaaaaaaaaa;
          local_17b8 = 0xaaaaaaaaaaaaaaaa;
          local_1820 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                                   (QString *)
                                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QString_&> *)
                     CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QFlags<MakefileGenerator::FileFixifyType>::QFlags
                    ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffdfb0,
                     in_stack_ffffffffffffdfac);
          uVar2 = _local_1af8;
          fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
          super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
               SUB84((ulong)_local_1af8 >> 0x20,0);
          MakefileGenerator::fileFixify
                    (in_stack_ffffffffffffe060,(QString *)in_stack_ffffffffffffe058,fix_00,
                     SUB81((ulong)in_stack_ffffffffffffe050 >> 0x38,0));
          _local_1af8 = uVar2;
          MakefileGenerator::filePrefixRoot
                    ((MakefileGenerator *)in_stack_ffffffffffffdfc8,
                     (QString *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )),(QString *)in_stack_ffffffffffffdfb8);
          (**(code **)(*in_RSI + 0x60))(&local_17c8,in_RSI,local_17e0);
          QString::~QString((QString *)0x1f84bc);
          QString::~QString((QString *)0x1f84c9);
          QString::~QString((QString *)0x1f84d6);
          local_1838 = ::operator+((char (*) [25])in_stack_ffffffffffffdfb0,
                                   (QString *)
                                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::operator+=((QString *)
                       CONCAT17(in_stack_ffffffffffffdfe7,
                                CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                       (QStringBuilder<const_char_(&)[25],_QString_&> *)in_stack_ffffffffffffdfd8);
          bVar4 = QList<ProString>::isEmpty((QList<ProString> *)0x1f851c);
          if (!bVar4) {
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
            QList<ProString>::append
                      ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                       (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            ProString::~ProString((ProString *)0x1f8566);
          }
          local_18a8 = ::operator+((char (*) [14])in_stack_ffffffffffffdfb0,
                                   (QString *)
                                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ProString::ProString<char_const(&)[14],QString&>
                    ((ProString *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )),
                     (QStringBuilder<const_char_(&)[14],_QString_&> *)in_stack_ffffffffffffdfb8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                     (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ProString::~ProString((ProString *)0x1f85d1);
          QString::~QString((QString *)0x1f85de);
          QString::~QString((QString *)0x1f85eb);
        }
      }
    }
    QString::~QString((QString *)0x1f8612);
    QString::~QString((QString *)0x1f861f);
    QString::~QString((QString *)0x1f862c);
    QString::~QString((QString *)0x1f8639);
    local_1fc9 = true;
    if (!bVar3) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                     (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QMakeEvaluator::first
                (&in_stack_ffffffffffffdfc8->super_QMakeEvaluator,
                 (ProKey *)
                 CONCAT17(in_stack_ffffffffffffdfc7,
                          CONCAT16(in_stack_ffffffffffffdfc6,
                                   CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0))));
      local_1fc9 = ProString::operator==
                             ((ProString *)
                              CONCAT17(in_stack_ffffffffffffdfd7,
                                       CONCAT16(in_stack_ffffffffffffdfd6,in_stack_ffffffffffffdfd0)
                                      ),(char *)in_stack_ffffffffffffdfc8);
      ProString::~ProString((ProString *)0x1f86f5);
      ProKey::~ProKey((ProKey *)0x1f870e);
    }
    if (local_1fc9 != false) {
      local_1920[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_1920[0].d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_1920[0].d.size = -0x5555555555555556;
      QList<QString>::QList((QList<QString> *)0x1f8755);
      QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
      this_01 = (MakefileGenerator *)
                QList<QString>::operator<<
                          ((QList<QString> *)in_stack_ffffffffffffdfb0,
                           (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8)
                          );
      QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
      QList<QString>::operator<<
                ((QList<QString> *)in_stack_ffffffffffffdfb0,
                 (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
      QString::~QString((QString *)0x1f87e1);
      QString::~QString((QString *)0x1f87ee);
      QString::~QString((QString *)0x1f87fb);
      local_1d48 = 0;
      while( true ) {
        lVar9 = (long)local_1d48;
        qVar8 = QList<QString>::size(local_1920);
        if (qVar8 <= lVar9) break;
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffdfb0,
                           CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        uVar14 = (undefined1)((ulong)lVar9 >> 0x38);
        QString::QString((QString *)in_stack_ffffffffffffdfb0,
                         (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
        QString::QString((QString *)0x1f88bd);
        bVar6 = ::operator==((QString *)in_stack_ffffffffffffdfb0,
                             (char **)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
        ;
        bVar1 = false;
        bVar4 = false;
        bVar3 = false;
        bVar13 = 0;
        if (bVar6) {
          in_stack_ffffffffffffdff8 = in_RSI[0x1b];
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          bVar1 = true;
          bVar6 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                             SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
          bVar13 = 0;
          if (bVar6) {
            QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8)
            ;
            bVar4 = true;
            bVar6 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                               SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
            bVar13 = 0;
            if (!bVar6) {
              in_stack_ffffffffffffdfe8 = (MakefileGenerator *)in_RSI[0x1b];
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffdfb0,
                             (char *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
              bVar3 = true;
              bVar6 = QMakeProject::isEmpty
                                (in_stack_ffffffffffffdfc8,
                                 (ProKey *)
                                 CONCAT17(in_stack_ffffffffffffdfc7,
                                          CONCAT16(in_stack_ffffffffffffdfc6,
                                                   CONCAT24(in_stack_ffffffffffffdfc4,
                                                            in_stack_ffffffffffffdfc0))));
              bVar13 = bVar6 ^ 0xff;
            }
          }
        }
        bVar11 = bVar13;
        if (bVar3) {
          ProKey::~ProKey((ProKey *)0x1f8a1b);
        }
        if (bVar4) {
          QString::~QString((QString *)0x1f8a34);
        }
        if (bVar1) {
          QString::~QString((QString *)0x1f8a4d);
        }
        if ((bVar13 & 1) != 0) {
          MakefileGenerator::prlFileName
                    ((MakefileGenerator *)
                     CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     SUB81((ulong)in_stack_ffffffffffffdfd8 >> 0x38,0));
          QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QString::~QString((QString *)0x1f8a90);
        }
        bVar3 = ::operator==((QString *)in_stack_ffffffffffffdfb0,
                             (char **)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
        ;
        bVar12 = 0;
        in_stack_ffffffffffffdfe6 = bVar12;
        if (bVar3) {
          in_stack_ffffffffffffdfd8 =
               (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
                *)in_RSI[0x1b];
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          bVar12 = QMakeProject::isActiveConfig
                             (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                              SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
          in_stack_ffffffffffffdfe6 = bVar12;
          QString::~QString((QString *)0x1f8b34);
        }
        if ((bVar12 & 1) != 0) {
          libtoolFileName((UnixMakefileGenerator *)CONCAT17(bVar11,in_stack_ffffffffffffe000),
                          SUB81((ulong)in_stack_ffffffffffffdff8 >> 0x38,0));
          QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QString::~QString((QString *)0x1f8b77);
        }
        bVar3 = ::operator==((QString *)in_stack_ffffffffffffdfb0,
                             (char **)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
        ;
        in_stack_ffffffffffffdfc7 = 0;
        bVar11 = in_stack_ffffffffffffdfc7;
        if (bVar3) {
          in_stack_ffffffffffffdfc8 = (QMakeProject *)in_RSI[0x1b];
          QString::QString((QString *)in_stack_ffffffffffffdfb8,(char *)in_stack_ffffffffffffdfe8);
          in_stack_ffffffffffffdfc7 =
               QMakeProject::isActiveConfig
                         (in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0,
                          SUB41(in_stack_ffffffffffffdfac >> 0x18,0));
          bVar11 = in_stack_ffffffffffffdfc7;
          QString::~QString((QString *)0x1f8c1b);
        }
        if ((in_stack_ffffffffffffdfc7 & 1) != 0) {
          MakefileGenerator::pkgConfigFileName(this_01,(bool)uVar14);
          QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                             (QString *)
                             CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QString::~QString((QString *)0x1f8c5e);
        }
        bVar3 = QString::isEmpty((QString *)0x1f8c6b);
        if (!bVar3) {
          QString::QString((QString *)in_stack_ffffffffffffdfb0,
                           (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
          ;
          bVar3 = QString::isEmpty((QString *)0x1f8cc2);
          if (!bVar3) {
            ::operator+((QString *)in_stack_ffffffffffffdfb0,
                        (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString_&,_QString_&> *)
                       CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            Option::fixPathToTargetOS
                      ((QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7,
                       (bool)in_stack_ffffffffffffdfc6);
            QString::operator=((QString *)in_stack_ffffffffffffdfb0,
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            QString::~QString((QString *)0x1f8d42);
            QString::~QString((QString *)0x1f8d4f);
          }
          _local_1af8 = 0xaaaaaaaaaaaaaaaa;
          local_1b38 = ::operator+((QString *)in_stack_ffffffffffffdfb0,
                                   (QString *)
                                   CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QString_&,_QString_&> *)
                     CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QFlags<MakefileGenerator::FileFixifyType>::QFlags
                    ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffdfb0,
                     in_stack_ffffffffffffdfac);
          uVar2 = _local_1af8;
          fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
          super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
               SUB84((ulong)_local_1af8 >> 0x20,0);
          fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
          super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
               fix_00.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
          _local_1af8 = uVar2;
          MakefileGenerator::fileFixify
                    (in_stack_ffffffffffffe060,(QString *)in_stack_ffffffffffffe058,fix,
                     SUB81((ulong)in_stack_ffffffffffffe050 >> 0x38,0));
          MakefileGenerator::filePrefixRoot
                    ((MakefileGenerator *)in_stack_ffffffffffffdfc8,
                     (QString *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )),(QString *)in_stack_ffffffffffffdfb8);
          QString::~QString((QString *)0x1f8e24);
          QString::~QString((QString *)0x1f8e31);
          bVar3 = QList<ProString>::isEmpty((QList<ProString> *)0x1f8e3e);
          if (!bVar3) {
            in_stack_ffffffffffffdfb8 = pQVar7;
            ProString::ProString
                      ((ProString *)in_stack_ffffffffffffdfb0,(char *)in_stack_ffffffffffffdfc8);
            QList<ProString>::append
                      ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                       (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            ProString::~ProString((ProString *)0x1f8e82);
          }
          in_stack_ffffffffffffdfb0 = pQVar7;
          (**(code **)(*in_RSI + 0x60))(local_1bd8,in_RSI,local_1af8);
          ::operator+((char (*) [14])in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0)
          ;
          ProString::ProString<char_const(&)[14],QString>
                    ((ProString *)
                     CONCAT17(in_stack_ffffffffffffdfc7,
                              CONCAT16(in_stack_ffffffffffffdfc6,
                                       CONCAT24(in_stack_ffffffffffffdfc4,in_stack_ffffffffffffdfc0)
                                      )),
                     (QStringBuilder<const_char_(&)[14],_QString> *)in_stack_ffffffffffffdfb8);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffdfb0,
                     (rvalue_ref)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          ProString::~ProString((ProString *)0x1f8efd);
          QStringBuilder<const_char_(&)[14],_QString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[14],_QString> *)0x1f8f0a);
          QString::~QString((QString *)0x1f8f17);
          local_1bf0 = 0xaaaaaaaaaaaaaaaa;
          local_1be8 = 0xaaaaaaaaaaaaaaaa;
          local_1be0 = 0xaaaaaaaaaaaaaaaa;
          QString::QString((QString *)in_stack_ffffffffffffdfb0,
                           (QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
          ;
          MakefileGenerator::fileInfo
                    ((MakefileGenerator *)
                     CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QString *)in_stack_ffffffffffffdfd8);
          QFileInfo::path();
          QFileInfo::~QFileInfo(local_1bf8);
          QString::~QString((QString *)0x1f8fa5);
          bVar3 = QString::isEmpty((QString *)0x1f8fb2);
          if (!bVar3) {
            bVar3 = QString::isEmpty((QString *)0x1f8fc3);
            if (!bVar3) {
              QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                                  (char *)in_stack_ffffffffffffdfc8);
            }
            MakefileGenerator::mkdir_p_asstring
                      ((MakefileGenerator *)
                       CONCAT17(bVar12,CONCAT16(bVar11,in_stack_ffffffffffffdfd0)),
                       (QString *)in_stack_ffffffffffffdfc8,(bool)in_stack_ffffffffffffdfc7);
            QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                                (QString *)
                                CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
            QString::~QString((QString *)0x1f901f);
          }
          bVar3 = QString::isEmpty((QString *)0x1f902c);
          if (!bVar3) {
            QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                                (char *)in_stack_ffffffffffffdfc8);
          }
          QString::toUpper((QString *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8))
          ;
          ::operator+((char (*) [7])in_stack_ffffffffffffdfb8,(QString *)in_stack_ffffffffffffdfb0);
          ::operator+((QStringBuilder<const_char_(&)[7],_QString> *)in_stack_ffffffffffffdfb8,
                      (char (*) [17])in_stack_ffffffffffffdfb0);
          ProKey::ProKey<QStringBuilder<char_const(&)[7],QString>,char_const(&)[17]>
                    ((ProKey *)in_stack_ffffffffffffdfb0,
                     (QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>
                      *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          MakefileGenerator::installMetaFile
                    (in_stack_ffffffffffffdfe8,
                     (ProKey *)
                     CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffdfe6,in_stack_ffffffffffffdfe0)),
                     (QString *)in_stack_ffffffffffffdfd8,
                     (QString *)CONCAT17(bVar12,CONCAT16(bVar11,in_stack_ffffffffffffdfd0)));
          QString::operator+=((QString *)in_stack_ffffffffffffdfb0,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
          QString::~QString((QString *)0x1f90f5);
          ProKey::~ProKey((ProKey *)0x1f9102);
          QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>::
          ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>
                           *)0x1f910f);
          QStringBuilder<const_char_(&)[7],_QString>::~QStringBuilder
                    ((QStringBuilder<const_char_(&)[7],_QString> *)0x1f911c);
          QString::~QString((QString *)0x1f9129);
          QString::~QString((QString *)0x1f9136);
          QString::~QString((QString *)0x1f9143);
          QString::~QString((QString *)0x1f9150);
        }
        QString::~QString((QString *)0x1f915d);
        QString::~QString((QString *)0x1f916a);
        local_1d48 = local_1d48 + 1;
      }
      QList<QString>::~QList((QList<QString> *)0x1f918d);
    }
    QString::~QString((QString *)0x1f91a2);
    ProStringList::~ProStringList((ProStringList *)0x1f91af);
    QString::~QString((QString *)0x1f91bc);
    QString::~QString((QString *)0x1f91c9);
    QString::~QString((QString *)0x1f91ed);
  }
  else {
    QString::QString((QString *)0x1f55e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString
UnixMakefileGenerator::defaultInstall(const QString &t)
{
    if(t != "target" || project->first("TEMPLATE") == "subdirs")
        return QString();

    enum { NoBundle, SolidBundle, SlicedBundle } bundle = NoBundle;
    bool isAux = (project->first("TEMPLATE") == "aux");
    const QString root = installRoot();
    ProStringList &uninst = project->values(ProKey(t + ".uninstall"));
    QString ret, destdir = project->first("DESTDIR").toQString();
    if(!destdir.isEmpty() && destdir.right(1) != Option::dir_sep)
        destdir += Option::dir_sep;
    QString targetdir = fileFixify(project->first("target.path").toQString(), FileFixifyAbsolute);
    if(targetdir.right(1) != Option::dir_sep)
        targetdir += Option::dir_sep;

    ProStringList links;
    QString target="$(TARGET)";
    const ProStringList &targets = project->values(ProKey(t + ".targets"));
    if(!project->isEmpty("QMAKE_BUNDLE")) {
        target = project->first("QMAKE_BUNDLE").toQString();
        bundle = project->isActiveConfig("sliced_bundle") ? SlicedBundle : SolidBundle;
    } else if(project->first("TEMPLATE") == "app") {
        target = "$(QMAKE_TARGET)";
    } else if(project->first("TEMPLATE") == "lib") {
            if (!project->isActiveConfig("staticlib")
                    && !project->isActiveConfig("plugin")
                    && !project->isActiveConfig("unversioned_libname")) {
                if(project->isEmpty("QMAKE_HPUX_SHLIB")) {
                    links << "$(TARGET0)" << "$(TARGET1)" << "$(TARGET2)";
                } else {
                    links << "$(TARGET0)";
                }
            }
    }
    for(int i = 0; i < targets.size(); ++i) {
        QString src = targets.at(i).toQString(),
                dst = escapeFilePath(filePrefixRoot(root, targetdir + src.section('/', -1)));
        if(!ret.isEmpty())
            ret += "\n\t";
        ret += "$(QINSTALL) " + escapeFilePath(Option::fixPathToTargetOS(src, false)) + ' ' + dst;
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        uninst.append("-$(DEL_FILE) " + dst);
    }

    {
        QString src_targ = target;
        if(!destdir.isEmpty())
            src_targ = Option::fixPathToTargetOS(destdir + target, false);
        QString plain_targ = filePrefixRoot(root, fileFixify(targetdir + target, FileFixifyAbsolute));
        QString dst_targ = plain_targ;
        plain_targ = escapeFilePath(plain_targ);
        if (bundle != NoBundle) {
            QString suffix;
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isActiveConfig("shallow_bundle"))
                    suffix += "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION");
                suffix += "/$(TARGET)";
            } else {
                suffix = "/" + project->first("QMAKE_BUNDLE_LOCATION") + "/$(QMAKE_TARGET)";
            }
            dst_targ += suffix;
            if (bundle == SolidBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += "$(DEL_FILE) -r " + plain_targ + "\n\t";
            } else {
                src_targ += suffix;
            }
        }
        src_targ = escapeFilePath(src_targ);
        dst_targ = escapeFilePath(dst_targ);

        QString copy_cmd;
        if (bundle == SolidBundle) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + plain_targ;
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + dst_targ;
        } else if (!isAux) {
            if (bundle == SlicedBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst_targ + "`\"", false);
            }
            copy_cmd += "$(QINSTALL_PROGRAM) " + src_targ + ' ' + dst_targ;
        }
        if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib")
           && project->values(ProKey(t + ".CONFIG")).indexOf("fix_rpath") != -1) {
            if (!ret.isEmpty())
                ret += "\n\t";
            if(!project->isEmpty("QMAKE_FIX_RPATH")) {
                ret += copy_cmd;
                ret += "\n\t-" + var("QMAKE_FIX_RPATH") + ' ' + dst_targ + ' ' + dst_targ;
            } else if(!project->isEmpty("QMAKE_LFLAGS_RPATH")) {
                ret += "-$(LINK) $(LFLAGS) " + var("QMAKE_LFLAGS_RPATH") + targetdir + " -o " +
                       dst_targ + " $(OBJECTS) $(LIBS) $(OBJCOMP)";
            } else {
                ret += copy_cmd;
            }
        } else if (!copy_cmd.isEmpty()) {
            if (!ret.isEmpty())
                ret += "\n\t";
            ret += copy_cmd;
        }

        if (isAux) {
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            if(!project->isEmpty("QMAKE_RANLIB"))
                ret += QString("\n\t$(RANLIB) ") + dst_targ;
        } else if (!project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip")
                   && !project->isEmpty("QMAKE_STRIP")) {
            ret += "\n\t-$(STRIP)";
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_LIB"))
                    ret += " " + var("QMAKE_STRIPFLAGS_LIB");
            } else if (project->first("TEMPLATE") == "app") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_APP"))
                    ret += " " + var("QMAKE_STRIPFLAGS_APP");
            }
            ret += ' ' + dst_targ;
        }
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        if (bundle == SolidBundle)
            uninst.append("-$(DEL_FILE) -r " + plain_targ);
        else if (!isAux)
            uninst.append("-$(DEL_FILE) " + dst_targ);
        if (bundle == SlicedBundle) {
            int dstlen = project->first("DESTDIR").length();
            for (const ProString &src : project->values("QMAKE_BUNDLED_FILES")) {
                ProString file = src.mid(dstlen);
                QString dst = escapeFilePath(
                            filePrefixRoot(root, fileFixify(targetdir + file, FileFixifyAbsolute)));
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst + "`\"", false) + "\n\t";
                ret += "-$(DEL_FILE) " + dst + "\n\t"; // Can't overwrite symlinks to directories
                ret += "$(QINSTALL) " + escapeFilePath(src) + " " + dst;
                if (!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + dst);
            }
        }
        if(!links.isEmpty()) {
            for(int i = 0; i < links.size(); ++i) {
                if (target_mode == TARG_UNIX_MODE || target_mode == TARG_MAC_MODE) {
                    QString link = Option::fixPathToTargetOS(destdir + links[i], false);
                    int lslash = link.lastIndexOf(Option::dir_sep);
                    if(lslash != -1)
                        link = link.right(link.size() - (lslash + 1));
                    QString dst_link = escapeFilePath(
                                filePrefixRoot(root, fileFixify(targetdir + link, FileFixifyAbsolute)));
                    ret += "\n\t-$(SYMLINK) $(TARGET) " + dst_link;
                    if(!uninst.isEmpty())
                        uninst.append("\n\t");
                    uninst.append("-$(DEL_FILE) " + dst_link);
                }
            }
        }
    }
    if (isAux || project->first("TEMPLATE") == "lib") {
        QStringList types;
        types << "prl" << "libtool" << "pkgconfig";
        for(int i = 0; i < types.size(); ++i) {
            const QString type = types.at(i);
            QString meta;
            if(type == "prl" && project->isActiveConfig("create_prl") && !project->isActiveConfig("no_install_prl") &&
               !project->isEmpty("QMAKE_INTERNAL_PRL_FILE"))
                meta = prlFileName(false);
            if (type == "libtool" && project->isActiveConfig("create_libtool"))
                meta = libtoolFileName(false);
            if(type == "pkgconfig" && project->isActiveConfig("create_pc"))
                meta = pkgConfigFileName(false);
            if(!meta.isEmpty()) {
                QString src_meta = meta;
                if(!destdir.isEmpty())
                    src_meta = Option::fixPathToTargetOS(destdir + meta, false);
                QString dst_meta = filePrefixRoot(root, fileFixify(targetdir + meta, FileFixifyAbsolute));
                if(!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + escapeFilePath(dst_meta));
                const QString dst_meta_dir = fileInfo(dst_meta).path();
                if(!dst_meta_dir.isEmpty()) {
                    if(!ret.isEmpty())
                        ret += "\n\t";
                    ret += mkdir_p_asstring(dst_meta_dir, true);
                }
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += installMetaFile(ProKey("QMAKE_" + type.toUpper() + "_INSTALL_REPLACE"), src_meta, dst_meta);
            }
        }
    }
    return ret;
}